

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::Hashing::hash_pnext_chain
               (StateRecorder *recorder,Hasher *h,void *pNext,DynamicStateInfo *dynamic_state_info,
               VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkStructureType VVar1;
  uint uVar2;
  VkPipeline pNext_00;
  VkPipeline *ppVVar3;
  bool bVar4;
  VkPipelineLibraryCreateInfoKHR *info;
  ulong uVar5;
  ulong uVar6;
  VkPipeline pNext_01;
  int *piVar7;
  byte bVar8;
  VkBaseInStructure *pin;
  char cVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  size_type local_58;
  string local_50;
  
  do {
    info = (VkPipelineLibraryCreateInfoKHR *)pnext_chain_skip_ignored_entries(pNext);
    if (info == (VkPipelineLibraryCreateInfoKHR *)0x0) break;
    VVar1 = info->sType;
    if (((ulong)VVar1 == 0x3ba1d6b2) || (VVar1 == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO))
    goto LAB_00125bb8;
    uVar5 = h->h * 0x100000001b3 ^ (ulong)VVar1;
    h->h = uVar5;
    pNext = info;
    if ((int)VVar1 < 0x3b9e3cd1) {
      if ((int)VVar1 < 0x3b9cf898) {
        if ((int)VVar1 < 0x3b9c5489) {
          if ((int)VVar1 < 0x3b9b9908) {
            if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT) {
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info->libraryCount;
              h->h = uVar5;
              if (dynamic_state_info != (DynamicStateInfo *)0x0) {
                cVar9 = dynamic_state_info->rasterization_stream;
joined_r0x001256bd:
                if (cVar9 != '\0') goto LAB_00125d93;
              }
              goto LAB_0012555b;
            }
            if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) goto LAB_00125ce9;
            if ((state_flags & 8) != 0) {
              h->h = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
            }
            if ((state_flags & 0xe) != 0) {
              h->h = h->h * 0x100000001b3 ^ (ulong)info->libraryCount;
            }
            if ((state_flags & 8) != 0) {
              if ((ulong)*(uint *)&info->field_0x14 != 0) {
                uVar5 = h->h;
                uVar6 = 0;
                do {
                  uVar5 = uVar5 * 0x100000001b3 ^
                          (ulong)*(uint *)((long)info->pLibraries + uVar6 * 4);
                  uVar6 = uVar6 + 1;
                } while (*(uint *)&info->field_0x14 != uVar6);
                h->h = uVar5;
              }
              uVar5 = h->h * 0x100000001b3 ^ (ulong)info[1].sType;
              h->h = uVar5;
              uVar6 = (ulong)*(uint *)&info[1].field_0x4;
              goto LAB_00125bae;
            }
          }
          else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
            uVar6 = (ulong)info->libraryCount;
            uVar5 = uVar5 * 0x100000001b3 ^ uVar6;
            h->h = uVar5;
            if (uVar6 != 0) {
              uVar11 = 0;
              do {
                uVar5 = uVar5 * 0x100000001b3 ^
                        (ulong)*(uint *)((long)info->pLibraries + uVar11 * 4);
                uVar11 = uVar11 + 1;
              } while (uVar6 != uVar11);
              h->h = uVar5;
            }
            uVar5 = (ulong)info[1].sType;
            uVar6 = h->h * 0x100000001b3 ^ uVar5;
            h->h = uVar6;
            if (uVar5 != 0) {
              uVar11 = 0;
              do {
                uVar6 = uVar6 * 0x100000001b3 ^ (ulong)*(uint *)((long)info[1].pNext + uVar11 * 4);
                uVar11 = uVar11 + 1;
              } while (uVar5 != uVar11);
              h->h = uVar6;
            }
            uVar6 = (ulong)info[1].libraryCount;
            uVar5 = h->h * 0x100000001b3 ^ uVar6;
            h->h = uVar5;
            if (uVar6 != 0) {
              uVar11 = 0;
              do {
                uVar5 = uVar5 * 0x100000001b3 ^
                        (ulong)*(uint *)((long)info[1].pLibraries + uVar11 * 4);
                uVar11 = uVar11 + 1;
              } while (uVar6 != uVar11);
              goto LAB_00125bb5;
            }
          }
          else {
            if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)&info->pLibraries + 4);
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->pLibraries;
              h->h = uVar5;
LAB_00125b9e:
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
              h->h = uVar5;
              goto LAB_00125bab;
            }
            if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT)
            goto LAB_00125ce9;
            uVar6 = uVar5 * 0x100000001b3 ^ (ulong)info->libraryCount;
            h->h = uVar6;
            uVar5 = 0;
            if (dynamic_state_info->discard_rectangle_mode == false) {
              uVar5 = (ulong)*(uint *)&info->field_0x14;
            }
            uVar5 = uVar5 ^ uVar6 * 0x100000001b3;
            h->h = uVar5;
            uVar2 = *(uint *)&info->pLibraries;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)uVar2;
            h->h = uVar5;
            if (((dynamic_state_info != (DynamicStateInfo *)0x0) &&
                (dynamic_state_info->discard_rectangle == false)) && (uVar2 != 0)) {
              lVar12 = *(long *)(info + 1);
              lVar10 = 0;
              do {
                uVar5 = (((uVar5 * 0x100000001b3 ^ (ulong)*(uint *)(lVar12 + lVar10)) *
                          0x100000001b3 ^ (ulong)*(uint *)(lVar12 + 4 + lVar10)) * 0x100000001b3 ^
                        (ulong)*(uint *)(lVar12 + 8 + lVar10)) * 0x100000001b3 ^
                        (ulong)*(uint *)(lVar12 + 0xc + lVar10);
                lVar10 = lVar10 + 0x10;
              } while ((ulong)uVar2 << 4 != lVar10);
              goto LAB_00125bb5;
            }
          }
        }
        else {
          if ((int)VVar1 < 0x3b9c9309) {
            if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT
               ) {
              uVar6 = uVar5 * 0x100000001b3 ^ (ulong)info->libraryCount;
              h->h = uVar6;
              if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
                 (dynamic_state_info->conservative_rasterization_mode == false)) {
                uVar5 = (ulong)*(uint *)&info->field_0x14;
              }
              else {
                uVar5 = 0;
              }
              uVar5 = uVar6 * 0x100000001b3 ^ uVar5;
              h->h = uVar5;
              if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
                 (dynamic_state_info->extra_primitive_overestimation_size == false))
              goto LAB_00125d9a;
LAB_00125d93:
              uVar6 = 0;
              goto LAB_00125bae;
            }
            if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT)
            goto LAB_00125ce9;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info->libraryCount;
            h->h = uVar5;
            if (dynamic_state_info != (DynamicStateInfo *)0x0) {
              cVar9 = dynamic_state_info->depth_clip_enable;
              goto joined_r0x001256bd;
            }
LAB_0012555b:
            uVar6 = (ulong)*(uint *)&info->field_0x14;
LAB_00125bae:
            uVar5 = uVar5 * 0x100000001b3 ^ uVar6;
            goto LAB_00125bb5;
          }
          if (VVar1 != VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO) {
            if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO) {
              if (dynamic_state_info != (DynamicStateInfo *)0x0) {
                cVar9 = dynamic_state_info->tessellation_domain_origin;
                goto joined_r0x00125c63;
              }
            }
            else if (VVar1 != VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO)
            goto LAB_00125ce9;
            goto LAB_00125bab;
          }
          uVar6 = (ulong)info->libraryCount;
          uVar5 = uVar5 * 0x100000001b3 ^ uVar6;
          h->h = uVar5;
          if (uVar6 != 0) {
            ppVVar3 = info->pLibraries;
            lVar12 = 0;
            do {
              uVar5 = ((uVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar3 + lVar12)) *
                       0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar3 + lVar12 + 4)) * 0x100000001b3
                      ^ (ulong)*(uint *)((long)ppVVar3 + lVar12 + 8);
              lVar12 = lVar12 + 0xc;
            } while (uVar6 * 0xc != lVar12);
            goto LAB_00125bb5;
          }
        }
      }
      else {
        if (0x3b9db030 < (int)VVar1) {
          if ((int)VVar1 < 0x3b9e1d92) {
            if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO) {
              if (VVar1 != VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE)
              goto LAB_00125ce9;
              ppVVar3 = info->pLibraries;
              if (ppVVar3 == (VkPipeline *)0x0) goto LAB_00125991;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info->libraryCount;
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)(ppVVar3 + 2);
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)ppVVar3 + 0x14);
              h->h = uVar5;
              h->h = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)(ppVVar3 + 3);
              pNext_00 = ppVVar3[1];
              pNext_01 = pNext_00;
              while (piVar7 = (int *)pnext_chain_skip_ignored_entries(pNext_01),
                    piVar7 != (int *)0x0) {
                if (*piVar7 != 0x3b9e7769) goto LAB_00125d6f;
                pNext_01 = *(VkPipeline *)(piVar7 + 2);
              }
              bVar4 = hash_pnext_chain(recorder,h,pNext_00,(DynamicStateInfo *)0x0,0);
              if (bVar4) goto LAB_00125bb8;
LAB_00125f37:
              bVar4 = true;
              goto LAB_00125bbe;
            }
            uVar6 = (ulong)info->libraryCount;
            uVar5 = uVar5 * 0x100000001b3 ^ uVar6;
            h->h = uVar5;
            if (uVar6 != 0) {
              uVar11 = 0;
              do {
                uVar5 = (uVar5 * 0x100000001b3 ^ (ulong)*(uint *)(info->pLibraries + uVar11)) *
                        0x100000001b3 ^ (ulong)*(uint *)((long)info->pLibraries + uVar11 * 8 + 4);
                uVar11 = uVar11 + 1;
              } while (uVar6 != uVar11);
              goto LAB_00125bb5;
            }
          }
          else {
            if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT) {
LAB_0012554e:
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info->libraryCount;
              h->h = uVar5;
              goto LAB_0012555b;
            }
            if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO)
            goto LAB_00125bab;
            if (VVar1 != VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR)
            goto LAB_00125ce9;
            lVar12 = *(long *)&info->libraryCount;
            if (lVar12 == 0) goto LAB_00125991;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)(lVar12 + 0x10);
            h->h = uVar5;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)(lVar12 + 0x14);
            h->h = uVar5;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)(lVar12 + 0x18);
            h->h = uVar5;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->pLibraries;
            h->h = uVar5;
            h->h = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)&info->pLibraries + 4);
            if (*(long *)(lVar12 + 8) != 0) goto LAB_00125f37;
          }
          goto LAB_00125bb8;
        }
        if ((int)VVar1 < 0x3b9d0c22) {
          if (VVar1 == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
            uVar6 = (ulong)*(uint *)((long)&info->pLibraries + 4);
            uVar5 = uVar5 * 0x100000001b3 ^ uVar6;
            h->h = uVar5;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
            h->h = uVar5;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->pLibraries;
            h->h = uVar5;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info->libraryCount;
            h->h = uVar5;
            if (uVar6 == 0) goto LAB_00125bb8;
            uVar11 = 0;
            do {
              uVar5 = (uVar5 * 0x100000001b3 ^ (ulong)*(uint *)(*(long *)(info + 1) + uVar11 * 8)) *
                      0x100000001b3 ^ (ulong)*(uint *)(*(long *)(info + 1) + 4 + uVar11 * 8);
              uVar11 = uVar11 + 1;
            } while (uVar6 != uVar11);
          }
          else {
            if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT)
            goto LAB_00125ce9;
            if (dynamic_state_info == (DynamicStateInfo *)0x0) {
              bVar8 = 0;
              cVar9 = '\0';
            }
            else {
              bVar8 = dynamic_state_info->sample_locations_enable;
              cVar9 = dynamic_state_info->sample_locations;
            }
            uVar6 = 0;
            if (bVar8 == 0) {
              uVar6 = (ulong)info->libraryCount;
            }
            uVar6 = uVar6 ^ uVar5 * 0x100000001b3;
            h->h = uVar6;
            if (((~bVar8 & info->libraryCount == 0) == 0) && (cVar9 == '\0')) {
              if (*(long *)(info + 1) != 0) goto LAB_00125f37;
              uVar5 = uVar6 * 0x100000001b3 ^ (ulong)*(uint *)((long)&info[1].pNext + 4);
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info[1].libraryCount;
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info[1].pNext;
              h->h = uVar5;
              uVar6 = (ulong)*(uint *)&info[1].field_0x14;
              uVar5 = uVar5 * 0x100000001b3 ^ uVar6;
              h->h = uVar5;
              if (uVar6 == 0) goto LAB_00125bb8;
              uVar11 = 0;
              do {
                uVar5 = (uVar5 * 0x100000001b3 ^ (ulong)*(uint *)(info[1].pLibraries + uVar11)) *
                        0x100000001b3 ^ (ulong)*(uint *)((long)info[1].pLibraries + uVar11 * 8 + 4);
                uVar11 = uVar11 + 1;
              } while (uVar6 != uVar11);
            }
            else {
              uVar5 = uVar6 * 0x100000001b3;
            }
          }
        }
        else {
          if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
            if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info->libraryCount;
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->pLibraries;
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)&info->pLibraries + 4);
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info[1].sType;
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info[1].field_0x4;
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info[1].pNext;
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)&info[1].pNext + 4);
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info[1].libraryCount;
              h->h = uVar5;
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info[1].field_0x14;
              h->h = uVar5;
              uVar6 = (ulong)*(uint *)&info[1].pLibraries;
              goto LAB_00125bae;
            }
            if (VVar1 != VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO)
            goto LAB_00125ce9;
            uVar6 = (ulong)info->libraryCount;
            uVar5 = uVar5 * 0x100000001b3 ^ uVar6;
            h->h = uVar5;
            if (uVar6 != 0) {
              uVar11 = 0;
              do {
                uVar5 = uVar5 * 0x100000001b3 ^
                        (ulong)*(uint *)((long)info->pLibraries + uVar11 * 4);
                uVar11 = uVar11 + 1;
              } while (uVar6 != uVar11);
              goto LAB_00125bb5;
            }
            goto LAB_00125bb8;
          }
          if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
             (dynamic_state_info->color_blend_advanced != true)) {
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info->libraryCount;
            h->h = uVar5;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
            h->h = uVar5;
LAB_00125d9a:
            uVar6 = (ulong)*(uint *)&info->pLibraries;
            goto LAB_00125bae;
          }
LAB_00125991:
          uVar5 = uVar5 * 0x100000001b3;
        }
LAB_00125bb5:
        h->h = uVar5;
      }
LAB_00125bb8:
      bVar4 = false;
      pNext = (VkPipelineLibraryCreateInfoKHR *)info->pNext;
    }
    else {
      if (0x3b9f948f < (int)VVar1) {
        if ((int)VVar1 < 0x3ba09a49) {
          if ((int)VVar1 < 0x3ba0251a) {
            if (VVar1 == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
              uVar5 = (*(ulong *)&info->libraryCount & 0xffffffff ^ uVar5 * 0x100000001b3) *
                      0x100000001b3 ^ *(ulong *)&info->libraryCount >> 0x20;
              h->h = uVar5;
              uVar5 = ((ulong)info->pLibraries & 0xffffffff ^ uVar5 * 0x100000001b3) * 0x100000001b3
                      ^ (ulong)info->pLibraries >> 0x20;
              h->h = uVar5;
              uVar5 = (*(ulong *)(info + 1) & 0xffffffff ^ uVar5 * 0x100000001b3) * 0x100000001b3 ^
                      *(ulong *)(info + 1) >> 0x20;
              h->h = uVar5;
              uVar5 = (ulong)info[1].pNext & 0xffffffff ^ uVar5 * 0x100000001b3;
              uVar6 = (ulong)info[1].pNext >> 0x20;
              goto LAB_00125bae;
            }
            if (VVar1 == VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT)
            goto LAB_00125bab;
          }
          else {
            if (VVar1 == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
              uVar6 = (ulong)info->libraryCount;
              uVar5 = uVar5 * 0x100000001b3 ^ uVar6;
              h->h = uVar5;
              if (uVar6 != 0) {
                uVar11 = 0;
                do {
                  uVar13 = (ulong)*(uint *)(info->pLibraries + uVar11 * 2);
                  uVar5 = uVar5 * 0x100000001b3 ^ uVar13;
                  if (uVar13 != 0) {
                    uVar14 = 0;
                    do {
                      uVar5 = uVar5 * 0x100000001b3 ^
                              (ulong)*(uint *)(info->pLibraries[uVar11 * 2 + 1] + uVar14 * 4);
                      uVar14 = uVar14 + 1;
                    } while (uVar13 != uVar14);
                  }
                  uVar11 = uVar11 + 1;
                } while (uVar11 != uVar6);
                goto LAB_00125bb5;
              }
              goto LAB_00125bb8;
            }
            if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT) {
              if (dynamic_state_info != (DynamicStateInfo *)0x0) {
                cVar9 = dynamic_state_info->depth_clip_negative_one_to_one;
                goto joined_r0x00125c63;
              }
LAB_00125bab:
              uVar6 = (ulong)info->libraryCount;
              goto LAB_00125bae;
            }
            if (VVar1 == VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT)
            goto LAB_0012554e;
          }
          goto LAB_00125ce9;
        }
        if ((int)VVar1 < 0x3ba1c711) {
          if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
            if (VVar1 != VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT)
            goto LAB_00125ce9;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info[1].sType;
            h->h = uVar5;
LAB_001259d4:
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info->libraryCount;
            h->h = uVar5;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
            h->h = uVar5;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->pLibraries;
            h->h = uVar5;
            uVar6 = (ulong)*(uint *)((long)&info->pLibraries + 4);
            goto LAB_00125bae;
          }
          uVar2 = info->libraryCount;
          uVar5 = uVar5 * 0x100000001b3 ^ (ulong)uVar2;
          h->h = uVar5;
          if (((dynamic_state_info != (DynamicStateInfo *)0x0) &&
              (dynamic_state_info->color_write_enable == false)) && (uVar2 != 0)) {
            uVar6 = 0;
            do {
              uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)info->pLibraries + uVar6 * 4);
              uVar6 = uVar6 + 1;
            } while (uVar2 != uVar6);
            goto LAB_00125bb5;
          }
        }
        else {
          if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) goto LAB_00125bab;
          if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO) {
            uVar5 = ((ulong)((uint)*(ulong *)&info->libraryCount & 0x7ffffc3f) ^
                    uVar5 * 0x100000001b3) * 0x100000001b3 ^ *(ulong *)&info->libraryCount >> 0x20;
            goto LAB_00125bb5;
          }
          if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT)
          goto LAB_00125ce9;
          if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
             (dynamic_state_info->depth_clamp_range == false)) {
            uVar2 = info->libraryCount;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)uVar2;
            h->h = uVar5;
            if (((ulong)uVar2 != 1) || (ppVVar3 = info->pLibraries, ppVVar3 == (VkPipeline *)0x0))
            goto LAB_00125991;
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)ppVVar3;
            h->h = uVar5;
            uVar6 = (ulong)*(uint *)((long)ppVVar3 + 4);
            goto LAB_00125bae;
          }
        }
        goto LAB_00125bb8;
      }
      if ((int)VVar1 < 0x3b9eaa31) {
        if ((int)VVar1 < 0x3b9e5442) {
          if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR) {
            if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
               (dynamic_state_info->fragment_shading_rate == false)) goto LAB_001259d4;
          }
          else {
            if (VVar1 != VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO) goto LAB_00125ce9;
            uVar6 = (ulong)info->libraryCount;
            uVar5 = uVar5 * 0x100000001b3 ^ uVar6;
            h->h = uVar5;
            if (info->pLibraries == (VkPipeline *)0x0) goto LAB_00125991;
            if (uVar6 != 0) {
              uVar11 = 0;
              do {
                uVar5 = uVar5 * 0x100000001b3 ^
                        (ulong)*(uint *)((long)info->pLibraries + uVar11 * 4);
                uVar11 = uVar11 + 1;
              } while (uVar6 != uVar11);
              goto LAB_00125bb5;
            }
          }
          goto LAB_00125bb8;
        }
        if (VVar1 != VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO) {
          if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) goto LAB_00125bab;
          if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT) goto LAB_0012554e;
          goto LAB_00125ce9;
        }
        uVar6 = (ulong)info->libraryCount;
        uVar5 = uVar5 * 0x100000001b3 ^ uVar6;
        h->h = uVar5;
        if (info->pLibraries == (VkPipeline *)0x0) {
          uVar5 = uVar5 * 0x100000001b3;
LAB_00125ec9:
          h->h = uVar5;
        }
        else if (uVar6 != 0) {
          uVar11 = 0;
          do {
            uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)info->pLibraries + uVar11 * 4);
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
          goto LAB_00125ec9;
        }
        if (*(uint **)(info + 1) == (uint *)0x0) {
          uVar5 = h->h * 0x100000001b3 ^ 0xffff;
        }
        else {
          uVar5 = h->h * 0x100000001b3 ^ (ulong)**(uint **)(info + 1);
        }
        h->h = uVar5;
        if ((uint *)info[1].pNext != (uint *)0x0) {
          uVar6 = (ulong)*info[1].pNext;
          goto LAB_00125bae;
        }
        uVar5 = uVar5 * 0x100000001b3 ^ 0xffff;
        goto LAB_00125bb5;
      }
      if ((int)VVar1 < 0x3b9f1b7a) {
        if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT
           ) {
          if (dynamic_state_info != (DynamicStateInfo *)0x0) {
            cVar9 = dynamic_state_info->provoking_vertex_mode;
joined_r0x00125c63:
            if (cVar9 != '\0') goto LAB_00125d93;
          }
          goto LAB_00125bab;
        }
        if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO)
        goto LAB_00125ce9;
        if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
           (bVar4 = true, dynamic_state_info->line_stipple_enable == false)) {
          bVar4 = *(int *)&info->field_0x14 != 0;
        }
        if (dynamic_state_info == (DynamicStateInfo *)0x0) {
          bVar8 = 1;
LAB_00125dc1:
          uVar6 = (ulong)info->libraryCount;
        }
        else {
          bVar8 = dynamic_state_info->line_stipple ^ 1;
          if (dynamic_state_info->line_rasterization_mode == false) goto LAB_00125dc1;
          uVar6 = 0;
        }
        uVar6 = uVar5 * 0x100000001b3 ^ uVar6;
        h->h = uVar6;
        if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
           (dynamic_state_info->line_stipple_enable == false)) {
          uVar5 = (ulong)*(uint *)&info->field_0x14;
        }
        else {
          uVar5 = 0;
        }
        uVar5 = uVar6 * 0x100000001b3 ^ uVar5;
        h->h = uVar5;
        uVar6 = (ulong)*(uint *)&info->pLibraries;
        if ((bVar4 & bVar8) == 0) {
          uVar6 = 0;
        }
        uVar6 = uVar6 ^ uVar5 * 0x100000001b3;
        h->h = uVar6;
        uVar5 = (ulong)*(ushort *)((long)&info->pLibraries + 4);
        if ((bVar4 & bVar8) == 0) {
          uVar5 = 0;
        }
        uVar5 = uVar6 * 0x100000001b3 ^ uVar5;
        goto LAB_00125bb5;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
        if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
           (dynamic_state_info->depth_bias == false)) goto LAB_00125b9e;
        goto LAB_00125991;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT) {
        uVar5 = uVar5 * 0x100000001b3 ^ (ulong)info->libraryCount;
        h->h = uVar5;
        uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->field_0x14;
        h->h = uVar5;
        uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)&info->pLibraries;
        h->h = uVar5;
        uVar5 = uVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)&info->pLibraries + 4);
        h->h = uVar5;
        uVar6 = (ulong)info[1].sType;
        goto LAB_00125bae;
      }
      if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) {
        bVar4 = hash_pnext_struct(recorder,h,info);
        if (!bVar4) goto LAB_00125f37;
        goto LAB_00125bb8;
      }
LAB_00125ce9:
      local_58 = 0x25;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_58);
      local_50.field_2._M_allocated_capacity = local_58;
      builtin_strncpy(local_50._M_dataplus._M_p,"Unsupported pNext found, cannot hash.",0x25);
      local_50._M_string_length = local_58;
      local_50._M_dataplus._M_p[local_58] = '\0';
      log_error_pnext_chain(&local_50,info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
LAB_00125d6f:
      bVar4 = true;
    }
LAB_00125bbe:
  } while (!bVar4);
  return info == (VkPipelineLibraryCreateInfoKHR *)0x0;
}

Assistant:

static bool hash_pnext_chain(const StateRecorder *recorder, Hasher &h, const void *pNext,
                             const DynamicStateInfo *dynamic_state_info,
                             VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);

		if (pnext_chain_stype_is_hash_invariant(pin->sType))
		{
			pNext = pin->pNext;
			continue;
		}

		h.s32(pin->sType);

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineTessellationDomainOriginStateCreateInfo *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineVertexInputDivisorStateCreateInfoKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationStateStreamCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineColorBlendAdvancedStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationConservativeStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkAttachmentDescriptionStencilLayoutKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext)))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext)))
				return false;
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkAttachmentReferenceStencilLayoutKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext), state_flags);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineColorWriteCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext), dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerReductionModeCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineDiscardRectangleStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkMemoryBarrier2KHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineFragmentShadingRateStateCreateInfoKHR *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerYcbcrConversionCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkGraphicsPipelineLibraryCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkPipelineLibraryCreateInfoKHR *>(pNext)))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineViewportDepthClipControlCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineCreateFlags2CreateInfoKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassCreationControlEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerBorderColorComponentMappingCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkMultisampledRenderToSingleSampledInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassFragmentDensityMapCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkSampleLocationsInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineViewportDepthClampControlCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderingAttachmentLocationInfoKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderingInputAttachmentIndexInfoKHR *>(pNext));
			break;

		default:
			log_error_pnext_chain("Unsupported pNext found, cannot hash.", pNext);
			return false;
		}

		pNext = pin->pNext;
	}

	return true;
}